

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command.h
# Opt level: O0

void brotli::GetLengthCode
               (size_t insertlen,size_t copylen,bool use_last_distance,uint16_t *code,
               uint64_t *extra)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint16_t uVar5;
  uint16_t copycode_00;
  uint64_t copyextraval;
  uint64_t insextraval;
  uint64_t numextra;
  uint64_t insnumextra;
  uint16_t copycode;
  uint16_t inscode;
  uint64_t *extra_local;
  uint16_t *code_local;
  bool use_last_distance_local;
  size_t copylen_local;
  size_t insertlen_local;
  
  uVar5 = GetInsertLengthCode(insertlen);
  copycode_00 = GetCopyLengthCode(copylen);
  uVar1 = *(uint *)(kInsExtra + (ulong)uVar5 * 4);
  uVar2 = *(uint *)(kCopyExtra + (ulong)copycode_00 * 4);
  uVar3 = *(uint *)(kInsBase + (ulong)uVar5 * 4);
  uVar4 = *(uint *)(kCopyBase + (ulong)copycode_00 * 4);
  uVar5 = CombineLengthCodes(uVar5,copycode_00,use_last_distance);
  *code = uVar5;
  *extra = (ulong)uVar1 + (ulong)uVar2 << 0x30 | copylen - uVar4 << ((byte)uVar1 & 0x3f) |
           insertlen - uVar3;
  return;
}

Assistant:

static inline void GetLengthCode(size_t insertlen, size_t copylen,
                                 bool use_last_distance,
                                 uint16_t* code, uint64_t* extra) {
  uint16_t inscode = GetInsertLengthCode(insertlen);
  uint16_t copycode = GetCopyLengthCode(copylen);
  uint64_t insnumextra = kInsExtra[inscode];
  uint64_t numextra = insnumextra + kCopyExtra[copycode];
  uint64_t insextraval = insertlen - kInsBase[inscode];
  uint64_t copyextraval = copylen - kCopyBase[copycode];
  *code = CombineLengthCodes(inscode, copycode, use_last_distance);
  *extra = (numextra << 48) | (copyextraval << insnumextra) | insextraval;
}